

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::ModAsyncify<false,_true,_false>::ModAsyncify(ModAsyncify<false,_true,_false> *this)

{
  ModAsyncify<false,_true,_false> *this_local;
  
  WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__ModAsyncify_02716130;
  wasm::Name::Name(&this->asyncifyStateName);
  this->unwinding = false;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }